

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  size_t sVar5;
  size_t *psVar6;
  undefined4 *puVar7;
  int *piVar8;
  pointer pMVar9;
  pointer pMVar10;
  byte bVar11;
  int iVar12;
  undefined4 *puVar13;
  long lVar14;
  int iVar15;
  pointer pMVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  undefined4 *puVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  undefined4 *puVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  undefined4 *puVar29;
  void *pvVar30;
  long lVar31;
  bool bVar32;
  int local_c8;
  Mat local_88;
  Mat *local_40;
  Mat *local_38;
  
  pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = pMVar10->dims;
  iVar12 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar1 == 1) {
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar14 == 0) {
      uVar18 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar8 = &pMVar10->w;
      uVar18 = 0;
      do {
        uVar18 = uVar18 + piVar8[-5] * *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    bVar11 = (uVar18 & 3) == 0 & opt->use_packing_layout;
    iVar23 = (uint)bVar11 + (uint)bVar11 * 2 + 1;
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,(int)uVar18 / iVar23,
                pMVar10->elemsize / (ulong)(long)pMVar10->elempack << bVar11 * '\x02',iVar23,
                opt->blob_allocator);
    pvVar30 = pMVar4->data;
    if (pvVar30 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar10) {
      lVar14 = 0x2c;
      uVar26 = 0;
      do {
        memcpy(pvVar30,*(void **)((long)pMVar10 + lVar14 + -0x2c),
               (long)*(int *)((long)&pMVar10->data + lVar14) *
               *(long *)((long)pMVar10 + lVar14 + -0x1c));
        pvVar30 = (void *)((long)pvVar30 +
                          (long)*(int *)((long)pMVar10 + lVar14 + -0x14) *
                          (long)*(int *)((long)&pMVar10->data + lVar14) * 4);
        uVar26 = uVar26 + 1;
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x48;
      } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                                3) * -0x71c71c71c71c71c7));
    }
  }
  iVar12 = (iVar12 >> 0x1f & uVar1) + iVar12;
  if ((uVar1 == 2) && (iVar12 == 0)) {
    iVar23 = pMVar10->w;
    sVar28 = pMVar10->elemsize;
    iVar19 = pMVar10->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar14 == 0) {
      uVar18 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar8 = &pMVar10->h;
      uVar18 = 0;
      do {
        if (*(ulong *)(piVar8 + -8) < sVar28) {
          sVar28 = *(ulong *)(piVar8 + -8);
        }
        iVar15 = piVar8[-6];
        if (iVar15 < iVar19) {
          iVar19 = iVar15;
        }
        uVar18 = uVar18 + iVar15 * *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    bVar11 = (uVar18 & 3) == 0 & opt->use_packing_layout;
    iVar15 = (uint)bVar11 + (uint)bVar11 * 2 + 1;
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar23,(int)uVar18 / iVar15,sVar28 / (ulong)(long)iVar19 << bVar11 * '\x02',
                iVar15,opt->blob_allocator);
    local_88.data = pMVar4->data;
    if ((undefined4 *)local_88.data == (undefined4 *)0x0) {
      return -100;
    }
    local_88.cstep = pMVar4->cstep;
    local_88.c = pMVar4->c;
    if (local_88.cstep * (long)local_88.c == 0) {
      return -100;
    }
    local_88.refcount = pMVar4->refcount;
    local_88.elemsize = pMVar4->elemsize;
    local_88.elempack = pMVar4->elempack;
    local_88.allocator = pMVar4->allocator;
    local_88.dims = pMVar4->dims;
    local_88.w = pMVar4->w;
    local_88.h = pMVar4->h;
    local_88.d = pMVar4->d;
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + 1;
      UNLOCK();
    }
    if ((iVar15 <= iVar19) ||
       ((Mat::create(&local_88,iVar23,(int)uVar18 / iVar19,sVar28,iVar19,opt->workspace_allocator),
        (undefined4 *)local_88.data != (undefined4 *)0x0 && ((long)local_88.c * local_88.cstep != 0)
        ))) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_40 = pMVar4;
      if (pMVar9 != pMVar10) {
        lVar14 = (long)iVar23;
        uVar26 = 0;
        puVar7 = (undefined4 *)local_88.data;
        do {
          pMVar16 = pMVar10 + uVar26;
          iVar21 = pMVar16->elempack;
          if (((iVar21 == 4) && (iVar19 == 1)) && (iVar2 = pMVar16->h, 0 < (long)iVar2)) {
            pvVar30 = pMVar16->data;
            iVar3 = pMVar16->w;
            sVar28 = pMVar16->elemsize;
            lVar22 = 0;
            do {
              if (0 < iVar23) {
                puVar24 = (undefined4 *)((long)iVar3 * sVar28 * lVar22 + (long)pvVar30);
                puVar13 = puVar7;
                iVar25 = iVar23;
                do {
                  *puVar13 = *puVar24;
                  puVar13[lVar14] = puVar24[1];
                  puVar13[iVar23 * 2] = puVar24[2];
                  puVar13[iVar23 * 3] = puVar24[3];
                  puVar13 = puVar13 + 1;
                  puVar24 = puVar24 + 4;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              puVar7 = puVar7 + lVar14 * 4;
              lVar22 = lVar22 + 1;
            } while (lVar22 != iVar2);
          }
          if (iVar21 == iVar19) {
            lVar22 = pMVar16->h * lVar14;
            memcpy(puVar7,pMVar16->data,pMVar16->elemsize * lVar22);
            local_c8 = (int)lVar22;
            puVar7 = puVar7 + (long)local_c8 * (long)pMVar16->elempack;
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < (ulong)(((long)pMVar9 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
      }
      if (iVar19 < iVar15) {
        convert_packing(&local_88,local_40,iVar15,opt);
      }
      if (local_88.refcount != (int *)0x0) {
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0019520e;
    }
    if (local_88.refcount == (int *)0x0) {
      return -100;
    }
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount != 0) {
      return -100;
    }
    if (local_88.allocator != (Allocator *)0x0) {
      (*(local_88.allocator)->_vptr_Allocator[3])();
      return -100;
    }
LAB_0019576f:
    iVar23 = -100;
    if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
      free(local_88.data);
    }
  }
  else {
LAB_0019520e:
    if ((uVar1 == 2) && (iVar12 == 1)) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar18 = pMVar10->h;
      sVar28 = pMVar10->elemsize;
      iVar23 = pMVar10->elempack;
      lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar14 == 0) {
        iVar19 = 0;
      }
      else {
        lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        piVar8 = &pMVar10->w;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + *piVar8;
          piVar8 = piVar8 + 0x12;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,iVar19,uVar18,sVar28,iVar23,opt->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar18) {
        uVar26 = 0;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pMVar16 = pMVar10;
          if (pMVar9 != pMVar10) {
            pvVar30 = (void *)((long)pMVar4->w * uVar26 * pMVar4->elemsize + (long)pMVar4->data);
            lVar14 = 0x2c;
            uVar27 = 0;
            do {
              lVar22 = (long)*(int *)((long)&pMVar16->data + lVar14);
              memcpy(pvVar30,(void *)(uVar26 * lVar22 * *(long *)((long)pMVar16 + lVar14 + -0x1c) +
                                     *(long *)((long)pMVar16 + lVar14 + -0x2c)),lVar22 * sVar28);
              pvVar30 = (void *)((long)pvVar30 +
                                (long)*(int *)((long)&pMVar16->data + lVar14) * (long)iVar23 * 4);
              uVar27 = uVar27 + 1;
              pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              lVar14 = lVar14 + 0x48;
            } while (uVar27 < (ulong)(((long)pMVar10 - (long)pMVar16 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar26 = uVar26 + 1;
          pMVar9 = pMVar10;
          pMVar10 = pMVar16;
        } while (uVar26 != uVar18);
      }
    }
    if ((uVar1 == 3) && (iVar12 == 0)) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar23 = pMVar10->w;
      iVar19 = pMVar10->h;
      sVar28 = pMVar10->elemsize;
      iVar15 = pMVar10->elempack;
      lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar14 == 0) {
        uVar18 = 0;
      }
      else {
        lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        psVar6 = &pMVar10->elemsize;
        uVar18 = 0;
        do {
          if (*psVar6 < sVar28) {
            sVar28 = *psVar6;
          }
          iVar21 = *(int *)(psVar6 + 1);
          if (iVar21 < iVar15) {
            iVar15 = iVar21;
          }
          uVar18 = uVar18 + iVar21 * *(int *)(psVar6 + 5);
          psVar6 = psVar6 + 9;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      bVar11 = (uVar18 & 3) == 0 & opt->use_packing_layout;
      iVar21 = (uint)bVar11 + (uint)bVar11 * 2 + 1;
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = (Mat *)CONCAT44(local_40._4_4_,iVar21);
      Mat::create(pMVar4,iVar23,iVar19,(int)uVar18 / iVar21,
                  sVar28 / (ulong)(long)iVar15 << bVar11 * '\x02',iVar21,opt->blob_allocator);
      local_88.data = pMVar4->data;
      if ((undefined4 *)local_88.data == (undefined4 *)0x0) {
        return -100;
      }
      local_88.cstep = pMVar4->cstep;
      local_88.c = pMVar4->c;
      if (local_88.cstep * (long)local_88.c == 0) {
        return -100;
      }
      local_88.refcount = pMVar4->refcount;
      local_88.elemsize = pMVar4->elemsize;
      local_88.elempack = pMVar4->elempack;
      local_88.allocator = pMVar4->allocator;
      local_88.dims = pMVar4->dims;
      local_88.w = pMVar4->w;
      local_88.h = pMVar4->h;
      local_88.d = pMVar4->d;
      if (local_88.refcount != (int *)0x0) {
        LOCK();
        *local_88.refcount = *local_88.refcount + 1;
        UNLOCK();
      }
      local_38 = pMVar4;
      if ((iVar15 < (int)local_40) &&
         ((Mat::create(&local_88,iVar23,iVar19,(int)uVar18 / iVar15,sVar28,iVar15,
                       opt->workspace_allocator), (undefined4 *)local_88.data == (undefined4 *)0x0
          || ((long)local_88.c * local_88.cstep == 0)))) {
        if (local_88.refcount == (int *)0x0) {
          return -100;
        }
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount != 0) {
          return -100;
        }
        if (local_88.allocator != (Allocator *)0x0) {
          (*(local_88.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_0019576f;
      }
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pMVar9 != pMVar10) {
        uVar27 = 0;
        uVar26 = 0;
        do {
          pMVar16 = pMVar10 + uVar27;
          iVar23 = pMVar16->elempack;
          if (((iVar23 == 4) && (iVar15 == 1)) && (iVar19 = pMVar16->c, 0 < (long)iVar19)) {
            iVar21 = pMVar16->h * pMVar16->w;
            sVar28 = pMVar16->cstep;
            sVar5 = pMVar16->elemsize;
            pvVar30 = pMVar16->data;
            lVar22 = local_88.cstep * local_88.elemsize;
            uVar26 = (ulong)(int)uVar26;
            puVar29 = (undefined4 *)((uVar26 + 3) * lVar22 + (long)local_88.data);
            puVar13 = (undefined4 *)((uVar26 + 2) * lVar22 + (long)local_88.data);
            puVar7 = (undefined4 *)((uVar26 + 1) * lVar22 + (long)local_88.data);
            puVar24 = (undefined4 *)(lVar22 * uVar26 + (long)local_88.data);
            lVar14 = 0;
            do {
              if (0 < iVar21) {
                puVar20 = (undefined4 *)(sVar28 * sVar5 * lVar14 + (long)pvVar30);
                lVar31 = 0;
                do {
                  puVar24[lVar31] = *puVar20;
                  puVar7[lVar31] = puVar20[1];
                  puVar13[lVar31] = puVar20[2];
                  puVar29[lVar31] = puVar20[3];
                  puVar20 = puVar20 + 4;
                  lVar31 = lVar31 + 1;
                } while (iVar21 != (int)lVar31);
              }
              uVar26 = uVar26 + 4;
              lVar14 = lVar14 + 1;
              puVar29 = puVar29 + lVar22;
              puVar13 = puVar13 + lVar22;
              puVar7 = puVar7 + lVar22;
              puVar24 = puVar24 + lVar22;
            } while (lVar14 != iVar19);
          }
          if (iVar23 == iVar15) {
            memcpy((undefined4 *)
                   (local_88.cstep * (long)(int)uVar26 * local_88.elemsize + (long)local_88.data),
                   pMVar16->data,(long)((int)pMVar16->cstep * pMVar16->c) * pMVar16->elemsize);
            uVar26 = (ulong)(uint)((int)uVar26 + pMVar16->c);
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < (ulong)(((long)pMVar9 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
      }
      if (iVar15 < (int)local_40) {
        convert_packing(&local_88,local_38,(int)local_40,opt);
      }
      if (local_88.refcount != (int *)0x0) {
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((uVar1 == 3) && (iVar12 == 1)) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar18 = pMVar10->c;
      sVar28 = pMVar10->elemsize;
      iVar23 = pMVar10->elempack;
      lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar14 == 0) {
        iVar19 = 0;
      }
      else {
        lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        piVar8 = &pMVar10->h;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + *piVar8;
          piVar8 = piVar8 + 0x12;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,pMVar10->w,iVar19,uVar18,sVar28,iVar23,opt->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar18) {
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar26 = 0;
        do {
          bVar32 = pMVar10 != pMVar9;
          pMVar10 = pMVar9;
          if (bVar32) {
            pvVar30 = (void *)(pMVar4->cstep * uVar26 * pMVar4->elemsize + (long)pMVar4->data);
            lVar14 = 0x40;
            uVar27 = 0;
            do {
              lVar22 = (long)*(int *)((long)pMVar9 + lVar14 + -0x10) *
                       (long)*(int *)((long)pMVar9 + lVar14 + -0x14);
              memcpy(pvVar30,(void *)(*(long *)((long)&pMVar9->data + lVar14) * uVar26 *
                                      *(long *)((long)pMVar9 + lVar14 + -0x30) +
                                     *(long *)((long)pMVar9 + lVar14 + -0x40)),lVar22 * sVar28);
              pvVar30 = (void *)((long)pvVar30 + (long)((int)lVar22 * iVar23) * 4);
              uVar27 = uVar27 + 1;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              lVar14 = lVar14 + 0x48;
            } while (uVar27 < (ulong)(((long)pMVar10 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar18);
      }
    }
    iVar23 = 0;
    if ((uVar1 == 3) && (iVar12 == 2)) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar1 = pMVar10->h;
      uVar18 = pMVar10->c;
      sVar28 = pMVar10->elemsize;
      iVar12 = pMVar10->elempack;
      lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar14 == 0) {
        iVar23 = 0;
      }
      else {
        lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        piVar8 = &pMVar10->w;
        iVar23 = 0;
        do {
          iVar23 = iVar23 + *piVar8;
          piVar8 = piVar8 + 0x12;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,iVar23,uVar1,uVar18,sVar28,iVar12,opt->blob_allocator);
      iVar23 = -100;
      if ((pMVar4->data != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
        if ((int)uVar18 < 1) {
          iVar23 = 0;
        }
        else {
          uVar26 = 0;
          do {
            if (0 < (int)uVar1) {
              pvVar30 = (void *)(pMVar4->cstep * uVar26 * pMVar4->elemsize + (long)pMVar4->data);
              uVar27 = 0;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                pMVar16 = pMVar10;
                if (pMVar9 != pMVar10) {
                  lVar14 = 0x40;
                  uVar17 = 0;
                  do {
                    lVar31 = (long)*(int *)((long)pMVar16 + lVar14 + -0x14);
                    lVar22 = *(long *)((long)pMVar16 + lVar14 + -0x30);
                    memcpy(pvVar30,(void *)(uVar27 * lVar31 * lVar22 +
                                           *(long *)((long)&pMVar16->data + lVar14) * uVar26 *
                                           lVar22 + *(long *)((long)pMVar16 + lVar14 + -0x40)),
                           lVar31 * sVar28);
                    pvVar30 = (void *)((long)pvVar30 +
                                      (long)*(int *)((long)pMVar16 + lVar14 + -0x14) * (long)iVar12
                                      * 4);
                    uVar17 = uVar17 + 1;
                    pMVar16 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar10 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_finish;
                    lVar14 = lVar14 + 0x48;
                  } while (uVar17 < (ulong)(((long)pMVar10 - (long)pMVar16 >> 3) *
                                           -0x71c71c71c71c71c7));
                }
                uVar27 = uVar27 + 1;
                pMVar9 = pMVar10;
                pMVar10 = pMVar16;
              } while (uVar27 != uVar1);
            }
            uVar26 = uVar26 + 1;
            iVar23 = 0;
          } while (uVar26 != uVar18);
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}